

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O3

SDKJsonResult * __thiscall
tonk::SDKSocket::Connect
          (SDKJsonResult *__return_storage_ptr__,SDKSocket *this,SDKConnection *sdkConnection,
          string *hostname,uint16_t port)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TonkConnectionConfig TVar2;
  SDKConnection *pSVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  TonkResult TVar5;
  TonkJson errorJson;
  SDKConnection *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_440;
  code *pcStack_438;
  code *pcStack_430;
  code *local_428;
  TonkJson local_420;
  
  paVar1 = &(__return_storage_ptr__->ErrorJson).field_2;
  p_Stack_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  pcStack_438 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  pcStack_430 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  local_428 = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
  local_448 = sdkConnection;
  if (fp_tonk_connect == (fp_tonk_connect_t)0x0) {
    sdkConnection->MyConnection = (TonkConnection)0x0;
    memset(&local_420,0,0x400);
    (__return_storage_ptr__->ErrorJson)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->ErrorJson)._M_string_length = 0;
    (__return_storage_ptr__->ErrorJson).field_2._M_local_buf[0] = '\0';
    TVar5 = Tonk_DLL_Not_Found;
  }
  else {
    TVar2.OnConnect = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
    TVar2.AppContextPtr = sdkConnection;
    TVar2.OnData = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
    TVar2.OnTick = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
    TVar2.OnClose = MakeConnectionConfig::anon_class_1_0_00000001::__invoke;
    TVar5 = (*fp_tonk_connect)(this->MySocket,TVar2,(hostname->_M_dataplus)._M_p,port,
                               &sdkConnection->MyConnection,&local_420);
    (__return_storage_ptr__->super_SDKResult).Result = Tonk_Success;
    (__return_storage_ptr__->ErrorJson)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->ErrorJson)._M_string_length = 0;
    (__return_storage_ptr__->ErrorJson).field_2._M_local_buf[0] = '\0';
    if (TVar5 == Tonk_Success) {
      std::__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<tonk::SDKConnection,void>
                ((__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2> *)&local_448,
                 (__weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> *)
                 &sdkConnection->super_enable_shared_from_this<tonk::SDKConnection>);
      p_Var4 = p_Stack_440;
      pSVar3 = local_448;
      local_448 = (SDKConnection *)0x0;
      p_Stack_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (sdkConnection->SelfReference).
                super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (sdkConnection->SelfReference).
      super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pSVar3;
      (sdkConnection->SelfReference).
      super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4
      ;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (p_Stack_440 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_440);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->super_SDKResult).Result = TVar5;
  strlen(local_420.JsonString);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->ErrorJson,0,(char *)0x0,(ulong)&local_420);
  return __return_storage_ptr__;
}

Assistant:

SDKJsonResult SDKSocket::Connect(
    SDKConnection* sdkConnection,
    const std::string& hostname, ///< [in] Hostname of the remote host
    uint16_t port ///< [in] Port for the remote host
)
{
    TonkConnectionConfig config = MakeConnectionConfig(sdkConnection);

    TonkJson errorJson;
    TonkResult result = tonk_connect(
        MySocket,
        config,
        hostname.c_str(),
        port,
        &sdkConnection->MyConnection,
        &errorJson);

    SDKJsonResult error;
    if (TONK_FAILED(result))
    {
        error.Result = result;
        error.ErrorJson = errorJson.JsonString;
    }
    else
    {
        // Hold a self-reference if connection is started
        sdkConnection->SelfReference = sdkConnection->shared_from_this();
    }
    return error;
}